

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::set(Group *this,uint16_t member_index,float value)

{
  float value_local;
  uint16_t member_index_local;
  Group *this_local;
  
  switch(member_index) {
  case 1:
  case 0xb:
  case 0xe:
  case 0x10:
  case 0x19:
  case 0x1c:
    _set_0_positive(this,member_index,value);
    break;
  case 2:
    set_sln_thr(this,(double)value);
    break;
  case 3:
    set_act_thr(this,(double)value);
    break;
  case 4:
    set_vis_thr(this,(double)value);
    break;
  case 5:
    set_c_sln(this,(double)value);
    break;
  case 6:
    set_c_sln_thr(this,(double)value);
    break;
  case 7:
    set_c_act(this,(double)value);
    break;
  case 8:
    set_c_act_thr(this,(double)value);
    break;
  case 9:
    _set_minus1_plus1(this,member_index,value);
    break;
  case 10:
  case 0xc:
  case 0x1d:
    _set_0_1(this,member_index,value);
    break;
  case 0xd:
  case 0xf:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1e:
    _set_0_plus1(this,member_index,value);
  }
  return;
}

Assistant:

void Group::set(uint16_t member_index, float value)
{
    switch (member_index) {
    case GRP_UPR:
    case GRP_DCY_PRD:
    case GRP_SLN_CHG_PRD:
    case GRP_ACT_CHG_PRD:
    case GRP_SLN_NTF_PRD:
    case GRP_ACT_NTF_PRD:
        _set_0_positive(member_index, value);
        return;

    case GRP_SLN_THR:
        set_sln_thr(value);
        return;

    case GRP_ACT_THR:
        set_act_thr(value);
        return;

    case GRP_VIS_THR:
        set_vis_thr(value);
        return;

    case GRP_C_SLN:
        set_c_sln(value);
        return;

    case GRP_C_SLN_THR:
        set_c_sln_thr(value);
        return;

    case GRP_C_ACT:
        set_c_act(value);
        return;

    case GRP_C_ACT_THR:
        set_c_act_thr(value);
        return;

    case GRP_DCY_PER:
        _set_minus1_plus1(member_index, value);
        return;

    case GRP_SLN_CHG_THR:
    case GRP_ACT_CHG_THR:
    case GRP_HIGH_SLN_THR:
    case GRP_LOW_SLN_THR:
    case GRP_HIGH_ACT_THR:
    case GRP_LOW_ACT_THR:
    case GRP_LOW_RES_THR:
        _set_0_plus1(member_index, value);
        return;

    case GRP_NTF_NEW:
    case GRP_DCY_TGT:
    case GRP_DCY_AUTO:
        _set_0_1(member_index, value);
        return;
    }
}